

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)22>_> *
vkt::BindingModel::anon_unknown_1::TexelBufferRenderInstance::createDescriptorSet
          (Move<vk::Handle<(vk::HandleType)22>_> *__return_storage_ptr__,DeviceInterface *vki,
          DescriptorUpdateMethod updateMethod,VkDevice device,VkDescriptorType descriptorType,
          ShaderInputInterface shaderInterface,VkDescriptorSetLayout layout,VkDescriptorPool pool,
          VkBufferView viewA,VkBufferView viewB,DescriptorSetUpdateBuilder *updateBuilder,
          Move<vk::Handle<(vk::HandleType)32>_> *updateTemplate,RawUpdateRegistry *updateRegistry,
          VkPipelineLayout pipelineLayout)

{
  RefData<vk::Handle<(vk::HandleType)22>_> data;
  RefData<vk::Handle<(vk::HandleType)22>_> data_00;
  ShaderInputInterface shaderInterface_00;
  VkDescriptorType descriptorType_00;
  VkDescriptorPool layout_00;
  Handle<(vk::HandleType)22> *pHVar1;
  VkPipelineLayout local_168;
  VkDescriptorSet local_160;
  VkBufferView local_158;
  VkBufferView local_150;
  VkDescriptorPool local_148;
  VkDescriptorSetLayout local_140;
  Move<vk::Handle<(vk::HandleType)22>_> local_138;
  RefData<vk::Handle<(vk::HandleType)22>_> local_118;
  Move<vk::Handle<(vk::HandleType)22>_> local_e8;
  RefData<vk::Handle<(vk::HandleType)22>_> local_c8;
  undefined1 local_a1;
  undefined1 local_a0 [8];
  VkDescriptorSetAllocateInfo allocInfo;
  ShaderInputInterface shaderInterface_local;
  VkDescriptorType descriptorType_local;
  VkDevice device_local;
  DescriptorUpdateMethod updateMethod_local;
  DeviceInterface *vki_local;
  VkPipelineLayout pipelineLayout_local;
  VkBufferView viewB_local;
  VkBufferView viewA_local;
  VkDescriptorPool pool_local;
  VkDescriptorSetLayout layout_local;
  Move<vk::Handle<(vk::HandleType)22>_> *descriptorSet;
  
  pool_local.m_internal = layout.m_internal;
  local_a0._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.pNext = (void *)pool.m_internal;
  allocInfo.descriptorPool.m_internal._0_4_ = 1;
  allocInfo._24_8_ = &pool_local;
  local_a1 = 0;
  allocInfo.pSetLayouts._0_4_ = shaderInterface;
  allocInfo.pSetLayouts._4_4_ = descriptorType;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(__return_storage_ptr__);
  if ((updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) ||
     (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE)) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(&local_138);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_118,(Move *)&local_138);
    data_00.deleter.m_deviceIface = local_118.deleter.m_deviceIface;
    data_00.object.m_internal = local_118.object.m_internal;
    data_00.deleter.m_device = local_118.deleter.m_device;
    data_00.deleter.m_pool.m_internal = local_118.deleter.m_pool.m_internal;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=
              (__return_storage_ptr__,data_00);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_138);
  }
  else {
    ::vk::allocateDescriptorSet(&local_e8,vki,device,(VkDescriptorSetAllocateInfo *)local_a0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_c8,(Move *)&local_e8);
    data.deleter.m_deviceIface = local_c8.deleter.m_deviceIface;
    data.object.m_internal = local_c8.object.m_internal;
    data.deleter.m_device = local_c8.deleter.m_device;
    data.deleter.m_pool.m_internal = local_c8.deleter.m_pool.m_internal;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=(__return_storage_ptr__,data);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_e8);
  }
  layout_00.m_internal = pool_local.m_internal;
  descriptorType_00 = allocInfo.pSetLayouts._4_4_;
  shaderInterface_00 = (ShaderInputInterface)allocInfo.pSetLayouts;
  if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) {
    local_140.m_internal = pool_local.m_internal;
    local_148.m_internal = pool.m_internal;
    local_150.m_internal = viewA.m_internal;
    local_158.m_internal = viewB.m_internal;
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    local_160.m_internal = pHVar1->m_internal;
    ::vk::Handle<(vk::HandleType)16>::Handle(&local_168,0);
    writeDescriptorSetWithTemplate
              (vki,device,descriptorType_00,shaderInterface_00,local_140,local_148,local_150,
               local_158,local_160,updateTemplate,updateRegistry,false,local_168);
  }
  else if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    writeDescriptorSetWithTemplate
              (vki,device,descriptorType_00,shaderInterface_00,
               (VkDescriptorSetLayout)layout_00.m_internal,pool,viewA,viewB,
               (VkDescriptorSet)pHVar1->m_internal,updateTemplate,updateRegistry,true,pipelineLayout
              );
  }
  else if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    writeDescriptorSet(vki,device,descriptorType_00,shaderInterface_00,
                       (VkDescriptorSetLayout)layout_00.m_internal,pool,viewA,viewB,
                       (VkDescriptorSet)pHVar1->m_internal,updateBuilder,
                       DESCRIPTOR_UPDATE_METHOD_WITH_PUSH);
  }
  else if (updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    writeDescriptorSet(vki,device,descriptorType_00,shaderInterface_00,
                       (VkDescriptorSetLayout)layout_00.m_internal,pool,viewA,viewB,
                       (VkDescriptorSet)pHVar1->m_internal,updateBuilder,
                       DESCRIPTOR_UPDATE_METHOD_NORMAL);
  }
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkDescriptorSet> TexelBufferRenderInstance::createDescriptorSet (const vk::DeviceInterface&					vki,
																			  DescriptorUpdateMethod						updateMethod,
																			  vk::VkDevice									device,
																			  vk::VkDescriptorType							descriptorType,
																			  ShaderInputInterface							shaderInterface,
																			  vk::VkDescriptorSetLayout						layout,
																			  vk::VkDescriptorPool							pool,
																			  vk::VkBufferView								viewA,
																			  vk::VkBufferView								viewB,
																			  vk::DescriptorSetUpdateBuilder&				updateBuilder,
																			  vk::Move<vk::VkDescriptorUpdateTemplateKHR>&	updateTemplate,
																			  RawUpdateRegistry&							updateRegistry,
																			  vk::VkPipelineLayout							pipelineLayout)
{
	const vk::VkDescriptorSetAllocateInfo	allocInfo			=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
		DE_NULL,
		pool,
		1u,
		&layout
	};

	vk::Move<vk::VkDescriptorSet>			descriptorSet;
	if (updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH && updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE)
	{
		descriptorSet = allocateDescriptorSet(vki, device, &allocInfo);
	}
	else
	{
		descriptorSet = vk::Move<vk::VkDescriptorSet>();
	}

	if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE)
	{
		writeDescriptorSetWithTemplate(vki, device, descriptorType, shaderInterface, layout, pool, viewA, viewB, *descriptorSet, updateTemplate, updateRegistry);
	}
	else if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE)
	{
		writeDescriptorSetWithTemplate(vki, device, descriptorType, shaderInterface, layout, pool, viewA, viewB, *descriptorSet, updateTemplate, updateRegistry, true, pipelineLayout);
	}
	else if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)
	{
		writeDescriptorSet(vki, device, descriptorType, shaderInterface, layout, pool, viewA, viewB, *descriptorSet, updateBuilder, updateMethod);
	}
	else if (updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL)
	{
		writeDescriptorSet(vki, device, descriptorType, shaderInterface, layout, pool, viewA, viewB, *descriptorSet, updateBuilder);
	}

	return descriptorSet;
}